

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::forEachNext
          (InvocationInterlockPlacementPass *this,uint32_t block_id,bool reverse_cfg,
          function<void_(unsigned_int)> *f)

{
  uint *puVar1;
  CFG *this_00;
  BasicBlock *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  undefined7 in_register_00000011;
  uint *puVar3;
  _Any_data local_60;
  code *local_50;
  undefined8 uStack_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = Pass::cfg(&this->super_Pass);
  if ((int)CONCAT71(in_register_00000011,reverse_cfg) == 0) {
    pvVar2 = CFG::preds(this_00,block_id);
    puVar1 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      std::function<void_(unsigned_int)>::operator()(f,*puVar3);
    }
  }
  else {
    this_01 = CFG::block(this_00,block_id);
    std::function<void_(unsigned_int)>::function((function<void_(unsigned_int)> *)&local_60,f);
    local_40._8_8_ = 0;
    local_40._M_unused._M_object = operator_new(0x20);
    *(undefined8 *)local_40._M_unused._0_8_ = 0;
    *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) = 0;
    *(undefined8 *)((long)local_40._M_unused._0_8_ + 0x10) = 0;
    *(undefined8 *)((long)local_40._M_unused._0_8_ + 0x18) = uStack_48;
    if (local_50 != (code *)0x0) {
      *(void **)local_40._M_unused._0_8_ = local_60._M_unused._M_object;
      *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) = local_60._8_8_;
      *(code **)((long)local_40._M_unused._0_8_ + 0x10) = local_50;
      local_50 = (code *)0x0;
      uStack_48 = 0;
    }
    local_28 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:70:34)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:70:34)>
               ::_M_manager;
    BasicBlock::ForEachSuccessorLabel(this_01,(function<void_(unsigned_int)> *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
  }
  return;
}

Assistant:

void InvocationInterlockPlacementPass::forEachNext(
    uint32_t block_id, bool reverse_cfg, std::function<void(uint32_t)> f) {
  if (reverse_cfg) {
    BasicBlock* block = cfg()->block(block_id);

    block->ForEachSuccessorLabel([f](uint32_t succ_id) { f(succ_id); });
  } else {
    for (uint32_t pred_id : cfg()->preds(block_id)) {
      f(pred_id);
    }
  }
}